

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeMatrixType(Builder *this,Id component,int cols,int rows)

{
  key_type kVar1;
  Id IVar2;
  uint uVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *this_00;
  mapped_type_conflict *pmVar7;
  Id local_50;
  Id local_4c;
  Id debugResultId;
  key_type local_40 [4];
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  Id column;
  int rows_local;
  int cols_local;
  Id component_local;
  Builder *this_local;
  
  type._4_4_ = rows;
  column = cols;
  rows_local = component;
  _cols_local = this;
  if (4 < cols || 4 < rows) {
    __assert_fail("cols <= maxMatrixSize && rows <= maxMatrixSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x181,"Id spv::Builder::makeMatrixType(Id, int, int)");
  }
  type._0_4_ = makeVectorType(this,component,rows);
  local_40[3] = 0;
  while( true ) {
    kVar1 = local_40[3];
    local_40[2] = 0x18;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_40 + 2);
    sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
    if ((int)sVar5 <= (int)kVar1) {
      this_00 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      spv::Instruction::Instruction(this_00,IVar2,0,OpTypeMatrix);
      pIStack_30 = this_00;
      spv::Instruction::reserveOperands(this_00,2);
      spv::Instruction::addIdOperand(pIStack_30,(Id)type);
      spv::Instruction::addImmediateOperand(pIStack_30,column);
      local_40[0] = 0x18;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_40);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar4,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
                 &stack0xffffffffffffffb8,pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffffb8);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xffffffffffffffb8);
      Module::mapInstruction(&this->module,pIStack_30);
      if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
        IVar2 = makeMatrixDebugType(this,(Id)type,column,true);
        local_4c = IVar2;
        local_50 = spv::Instruction::getResultId(pIStack_30);
        pmVar7 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,&local_50);
        *pmVar7 = IVar2;
      }
      IVar2 = spv::Instruction::getResultId(pIStack_30);
      return IVar2;
    }
    local_40[1] = 0x18;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_40 + 1);
    ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar4,(long)(int)local_40[3]);
    pIStack_30 = *ppIVar6;
    IVar2 = spv::Instruction::getIdOperand(pIStack_30,0);
    if ((IVar2 == (Id)type) &&
       (uVar3 = spv::Instruction::getImmediateOperand(pIStack_30,1), uVar3 == column)) break;
    local_40[3] = local_40[3] + 1;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_30);
  return IVar2;
}

Assistant:

Id Builder::makeMatrixType(Id component, int cols, int rows)
{
    assert(cols <= maxMatrixSize && rows <= maxMatrixSize);

    Id column = makeVectorType(component, rows);

    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeMatrix].size(); ++t) {
        type = groupedTypes[OpTypeMatrix][t];
        if (type->getIdOperand(0) == column &&
            type->getImmediateOperand(1) == (unsigned)cols)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeMatrix);
    type->reserveOperands(2);
    type->addIdOperand(column);
    type->addImmediateOperand(cols);
    groupedTypes[OpTypeMatrix].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeMatrixDebugType(column, cols);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}